

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.cpp
# Opt level: O0

void __thiscall Args_Multiple_Test::TestBody(Args_Multiple_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  char **ppcVar7;
  AssertHelper *this_00;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__3;
  char **argv_1;
  int nthreads_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  char **argv;
  bool log;
  int nthreads;
  anon_class_1_0_00000001 expectNoError;
  undefined1 in_stack_fffffffffffffacf;
  AssertionResult *in_stack_fffffffffffffad0;
  AssertionResult *pAVar8;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  int iVar9;
  undefined6 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf6;
  undefined1 in_stack_fffffffffffffaf7;
  undefined8 in_stack_fffffffffffffaf8;
  Type TVar10;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  char *in_stack_fffffffffffffb08;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  char *in_stack_fffffffffffffb38;
  char *actual_predicate_value;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  AssertionResult *in_stack_fffffffffffffb48;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  string local_410 [48];
  AssertionResult local_3e0 [2];
  undefined4 local_3bc;
  AssertionResult local_3b8;
  string local_3a8 [48];
  undefined1 local_378 [24];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffca0;
  bool *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  char ***in_stack_fffffffffffffcb8;
  AssertionResult local_330 [2];
  allocator<char> local_309;
  string local_308 [32];
  AssertionResult local_2e8;
  string local_2d8 [48];
  char local_2a8 [39];
  undefined1 local_281 [33];
  AssertionResult local_260;
  allocator<char> local_249;
  string local_248 [32];
  AssertHelper *local_228;
  undefined4 local_21c;
  allocator<char> local_201;
  string local_200 [32];
  AssertionResult local_1e0;
  string local_1d0 [48];
  AssertionResult local_1a0 [2];
  undefined4 local_17c;
  AssertionResult local_178;
  string local_168 [87];
  allocator<char> local_111;
  string local_110 [32];
  AssertionResult local_f0;
  string local_e0 [87];
  allocator<char> local_89;
  string local_88 [32];
  AssertionResult local_68 [2];
  allocator<char> local_41;
  string local_40 [32];
  char **local_20;
  undefined1 local_11;
  undefined4 local_10;
  
  TVar10 = (Type)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_10 = 0;
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  ppcVar7 = makeArgs((string *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = ppcVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  std::function<void(std::__cxx11::string)>::function<Args_Multiple_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffae0,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  pbrt::ParseArg<bool*>
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffca0);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58bc0d);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb48,
               (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb38,
               (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0)),
               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0x58bdb3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58be2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  std::function<void(std::__cxx11::string)>::function<Args_Multiple_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffae0,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  uVar2 = pbrt::ParseArg<int*>
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (int *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58bed5);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb48,
               (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb38,
               (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0)),
               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    std::__cxx11::string::~string(local_168);
    testing::Message::~Message((Message *)0x58c044);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58c0bc);
  local_17c = 4;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
             (int *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             (int *)in_stack_fffffffffffffad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    testing::AssertionResult::failure_message((AssertionResult *)0x58c169);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0)),
               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    testing::Message::~Message((Message *)0x58c1cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58c221);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb48,
               (char *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb38,
               (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0)),
               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    std::__cxx11::string::~string(local_1d0);
    testing::Message::~Message((Message *)0x58c33d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58c3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
            (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             &in_stack_fffffffffffffad0->success_);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    testing::AssertionResult::failure_message((AssertionResult *)0x58c4fd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0)),
               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffb50,(Message *)in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    testing::Message::~Message((Message *)0x58c560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58c5b8);
  local_21c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  this_00 = (AssertHelper *)makeArgs((string *)CONCAT17(uVar2,in_stack_fffffffffffffbb0));
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  assertion_result = (AssertionResult *)local_281;
  local_228 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  actual_predicate_value = local_2a8;
  std::function<void(std::__cxx11::string)>::function<Args_Multiple_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffae0,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  uVar2 = pbrt::ParseArg<int*>
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (int *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58c6d4);
  std::__cxx11::string::~string((string *)(local_281 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_281);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!(bool)uVar3) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT17(uVar2,in_stack_fffffffffffffb40),
               actual_predicate_value,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0)),
               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    std::__cxx11::string::~string(local_2d8);
    testing::Message::~Message((Message *)0x58c886);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58c901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[5]>
            (in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             &in_stack_fffffffffffffad0->success_);
  iVar9 = (int)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    in_stack_fffffffffffffb10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x58ca34);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(in_stack_fffffffffffffaf7,
                                CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0)),iVar9
               ,(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    testing::Message::~Message((Message *)0x58ca91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58cae9);
  local_228 = local_228 + 1;
  __s = &stack0xfffffffffffffcaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,__s,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  TVar10 = (Type)((ulong)local_378 >> 0x20);
  std::function<void(std::__cxx11::string)>::function<Args_Multiple_Test::TestBody()::__0&,void>
            (in_stack_fffffffffffffae0,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  uVar4 = pbrt::ParseArg<int*>
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (int *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x58cb92);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcaf);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(local_330);
  if (!(bool)uVar5) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffb00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT17(uVar2,in_stack_fffffffffffffb40),
               actual_predicate_value,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffaf6,in_stack_fffffffffffffaf0))
               ,iVar9,(char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    std::__cxx11::string::~string(local_3a8);
    testing::Message::~Message((Message *)0x58ccfb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58cd73);
  local_3bc = 4;
  pAVar8 = &local_3b8;
  testing::internal::EqHelper<false>::Compare<int,int>
            (&pAVar8->success_,(char *)in_stack_fffffffffffffae0,
             (int *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             (int *)in_stack_fffffffffffffad0);
  uVar6 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
  iVar9 = (int)((ulong)pAVar8 >> 0x20);
  if (!(bool)uVar6) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffb00));
    in_stack_fffffffffffffae0 =
         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x58ce14);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffaf0)),iVar9,
               (char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    testing::Message::~Message((Message *)0x58ce71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58cec6);
  pAVar8 = local_3e0;
  testing::AssertionResult::AssertionResult(pAVar8,(bool)in_stack_fffffffffffffacf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffb00));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT17(uVar2,in_stack_fffffffffffffb40),
               actual_predicate_value,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb30));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffb00),TVar10,
               (char *)CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffaf0)),iVar9,
               (char *)in_stack_fffffffffffffae0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar8);
    std::__cxx11::string::~string(local_410);
    testing::Message::~Message((Message *)0x58cfdf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x58d057);
  return;
}

Assistant:

TEST(Args, Multiple) {
    auto expectNoError = [](const std::string &s) { ASSERT_FALSE(true); };

    {
        int nthreads = 0;
        bool log = false;
        auto argv = makeArgs("--log --nthreads 4 yolo");
        EXPECT_TRUE(ParseArg(&argv, "log", &log, expectNoError));
        EXPECT_TRUE(ParseArg(&argv, "nthreads", &nthreads, expectNoError));
        EXPECT_EQ(nthreads, 4);
        EXPECT_TRUE(log);
        EXPECT_EQ(std::string(*argv), "yolo");
    }
    {
        int nthreads = 0;
        auto argv = makeArgs("yolo --nthreads=4");
        EXPECT_FALSE(ParseArg(&argv, "nthreads", &nthreads, expectNoError));
        EXPECT_EQ(std::string(*argv), "yolo");
        ++argv;
        EXPECT_TRUE(ParseArg(&argv, "nthreads", &nthreads, expectNoError));
        EXPECT_EQ(nthreads, 4);
        EXPECT_TRUE(*argv == nullptr);
    }
}